

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlitePagerCommit(Pager *pPager)

{
  sxi32 *psVar1;
  Page *pPVar2;
  Page *pPVar3;
  int iVar4;
  char *zErr;
  unqlite *pDb;
  long lVar5;
  bool bVar6;
  int get_excl;
  int local_12c;
  Page *local_128 [33];
  
  local_12c = 0;
  iVar4 = 0;
  if ((pPager->iState < 3) || (iVar4 = 0, pPager->is_mem != 0)) goto LAB_0010eade;
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-Only database");
    iVar4 = -0x4b;
    goto LAB_0010eade;
  }
  iVar4 = unqliteFinalizeJournal(pPager,&local_12c,1);
  if (iVar4 != 0) goto LAB_0010eade;
  pPVar3 = pPager->pFirstDirty;
  if (pPVar3 == (Page *)0x0) {
    pPVar3 = (Page *)0x0;
  }
  else {
    memset(local_128,0,0x100);
    do {
      pPVar2 = pPVar3->pDirtyPrev;
      pPVar3->pDirtyPrev = (Page *)0x0;
      lVar5 = 0;
      do {
        if (local_128[lVar5] == (Page *)0x0) {
          local_128[lVar5] = pPVar3;
          bVar6 = lVar5 == 0x1f;
          goto LAB_0010e9b8;
        }
        pPVar3 = page_merge_dirty(local_128[lVar5],pPVar3);
        local_128[lVar5] = (Page *)0x0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1f);
      bVar6 = true;
LAB_0010e9b8:
      if (bVar6) {
        local_128[0x1f] = page_merge_dirty(local_128[0x1f],pPVar3);
      }
      pPVar3 = pPVar2;
    } while (pPVar2 != (Page *)0x0);
    lVar5 = 1;
    do {
      local_128[0] = page_merge_dirty(local_128[0],local_128[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    local_128[0]->pDirtyNext = (Page *)0x0;
    pPVar3 = local_128[0];
  }
  if (local_12c == 0) {
LAB_0010ea31:
    if ((pPager->iFlags & 2) != 0) {
      (*pPager->pfd->pMethods->xSync)(pPager->pfd,2);
    }
    iVar4 = pager_write_dirty_pages(pPager,pPVar3);
    if (iVar4 == 0) {
      while (pPVar3 = pPager->pAll, pPVar3 != (Page *)0x0) {
        pager_unlink_page(pPager,pPVar3);
        pager_release_page(pPager,pPVar3);
      }
      if (pPager->dbSize != pPager->dbOrigSize) {
        (*pPager->pfd->pMethods->xTruncate)(pPager->pfd,pPager->dbSize * (long)pPager->iPageSize);
      }
      (*pPager->pfd->pMethods->xSync)(pPager->pfd,3);
      pPager->iJournalOfft = 0;
      pPager->nRec = 0;
      iVar4 = 0;
      goto LAB_0010eade;
    }
    *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 1;
    pPager->pFirstDirty = pPVar3;
    pDb = pPager->pDb;
    zErr = "IO error while writing dirty pages, rollback your database";
  }
  else {
    iVar4 = pager_wait_on_lock(pPager,4);
    if (iVar4 == 0) goto LAB_0010ea31;
    pDb = pPager->pDb;
    zErr = "Cannot obtain an Exclusive lock on the target database";
  }
  unqliteGenError(pDb,zErr);
LAB_0010eade:
  if (iVar4 == 0) {
    if ((pPager->is_mem == 0) && (1 < (uint)pPager->iState)) {
      if (pPager->no_jrnl == 0) {
        (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
      }
      if (pPager->iLock != 0) {
        (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
        pPager->iLock = 1;
      }
      pPager->iState = 1;
      if (pPager->pVec != (Bitvec *)0x0) {
        unqliteBitvecDestroy(pPager->pVec);
        pPager->pVec = (Bitvec *)0x0;
      }
    }
    *(byte *)&pPager->iFlags = (byte)pPager->iFlags & 0xfe;
    iVar4 = 0;
  }
  else {
    psVar1 = &pPager->pDb->iFlags;
    *psVar1 = *psVar1 | 1;
  }
  return iVar4;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerCommit(Pager *pPager)
{
	int rc;
	/* Commit: Phase One */
	rc = pager_commit_phase1(pPager);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Commit: Phase Two */
	rc = pager_commit_phase2(pPager);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Remove stale flags */
	pPager->iFlags &= ~PAGER_CTRL_COMMIT_ERR;
	/* All done */
	return UNQLITE_OK;
fail:
	/* Disable the auto-commit flag */
	pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
	return rc;
}